

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

int xercesc_4_0::XMLString::compareString(XMLCh *str1,XMLCh *str2)

{
  ushort uVar1;
  XMLSize_t XVar2;
  long lVar3;
  
  if (str2 == (XMLCh *)0x0 || str1 == (XMLCh *)0x0) {
    if (str1 == (XMLCh *)0x0) {
      XVar2 = stringLen(str2);
      return -(int)XVar2;
    }
    if (str2 == (XMLCh *)0x0) {
      XVar2 = stringLen(str1);
      return (int)XVar2;
    }
  }
  lVar3 = 0;
  while( true ) {
    uVar1 = *(ushort *)((long)str1 + lVar3);
    if (uVar1 != *(ushort *)((long)str2 + lVar3)) {
      return (uint)uVar1 - (uint)*(ushort *)((long)str2 + lVar3);
    }
    if (uVar1 == 0) break;
    lVar3 = lVar3 + 2;
  }
  return 0;
}

Assistant:

int XMLString::compareString(   const   XMLCh* const    str1
                                , const XMLCh* const    str2)
{
    const XMLCh* psz1 = str1;
    const XMLCh* psz2 = str2;

    if (psz1 == 0 || psz2 == 0) {

        if (psz1 == 0) {
            return 0 - (int)XMLString::stringLen(psz2);
        }
		else if (psz2 == 0) {
            return (int)XMLString::stringLen(psz1);
        }
    }

    for (;;)
    {
        // If an inequality, then return the difference
        if (*psz1 != *psz2)
            return int(*psz1) - int(*psz2);

        // If either has ended, then they both ended, so equal
        if (!*psz1)
            break;

        // Move upwards for the next round
        psz1++;
        psz2++;
    }
    return 0;
}